

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O1

optional<supermap::ByteArray<2UL>_> __thiscall
supermap::Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>::getValue
          (Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *this,Key<2UL> *k)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  undefined8 extraout_RDX_01;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  optional<supermap::ByteArray<2UL>_> oVar4;
  optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_> foundOnDisk;
  undefined1 local_70 [8];
  _func_int **local_68;
  char local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  code *local_20;
  
  auVar2 = (**(code **)(**(long **)(k + 4) + 8))();
  if ((auVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_38 = 0;
    uStack_30 = 0;
    local_20 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:97:17)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:97:17)>
               ::_M_manager;
    local_58 = 0;
    uStack_50 = 0;
    local_40 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:98:17)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:98:17)>
               ::_M_manager;
    (**(code **)**(undefined8 **)(k + 0xc))(local_70);
    uVar1 = extraout_RDX;
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
      uVar1 = extraout_RDX_00;
    }
    auVar3._8_8_ = uVar1;
    auVar3._0_8_ = local_28;
    if (local_28 != (code *)0x0) {
      auVar3 = (*local_28)(&local_38,&local_38,3);
    }
    auVar2._8_8_ = auVar3._8_8_;
    auVar2._0_8_ = local_68;
    if (local_60 == '\0') {
      *(undefined1 *)
       &(this->innerStorage_)._M_t.
        super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
        .
        super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_false>
        ._M_head_impl = 0;
      auVar2 = auVar3;
    }
  }
  else {
    local_60 = '\x01';
  }
  uVar1 = auVar2._8_8_;
  if (local_60 != '\0') {
    (**(code **)(**(long **)(k + 8) + 0x20))(local_70,*(long **)(k + 8),auVar2._0_8_);
    (this->super_KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>).
    _vptr_KeyValueStorage = local_68;
    *(undefined1 *)
     &(this->innerStorage_)._M_t.
      super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
      .
      super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_false>
      ._M_head_impl = 1;
    uVar1 = extraout_RDX_01;
  }
  oVar4.super__Optional_base<supermap::ByteArray<2UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<2UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<2UL>_>._8_8_ = uVar1;
  oVar4.super__Optional_base<supermap::ByteArray<2UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<2UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<2UL>_>._M_payload =
       (_Storage<supermap::ByteArray<2UL>,_false>)this;
  return (optional<supermap::ByteArray<2UL>_>)
         oVar4.super__Optional_base<supermap::ByteArray<2UL>,_false,_false>._M_payload.
         super__Optional_payload<supermap::ByteArray<2UL>,_true,_false,_false>.
         super__Optional_payload_base<supermap::ByteArray<2UL>_>;
}

Assistant:

std::optional<Value> getValue(const Key &k) override {
        IndexT index;
        if (auto optIndex = innerStorage_->getValue(k); optIndex.has_value()) {
            index = optIndex.value();
        } else {
            std::optional<KeyIndex> foundOnDisk = diskIndex_->find(
                k,
                [](const KeyIndex &ki, const Key &key) { return ki.key < key; },
                [](const KeyIndex &ki, const Key &key) { return ki.key == key; }
            );
            if (!foundOnDisk.has_value()) {
                return std::nullopt;
            }
            index = foundOnDisk.value().value;
        }
        return std::optional{diskDataStorage_->get(index).value};
    }